

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomNurbsCurves>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomNurbsCurves *curves,string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __x;
  Property *this;
  _Base_ptr *this_00;
  double t;
  pointer pSVar1;
  allocator aVar2;
  ostringstream oVar3;
  bool bVar4;
  __type _Var5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ostream *poVar9;
  value_type *pvVar10;
  _Base_ptr p_Var11;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar12;
  value_type *value;
  size_type sVar13;
  mapped_type *this_01;
  _Base_ptr p_Var14;
  Property *pPVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  string *__v;
  Property *args_1;
  long lVar18;
  undefined4 in_stack_fffffffffffffb2c;
  ParseResult ret_8;
  allocator local_489;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_478;
  ParseResult ret;
  optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
  local_420;
  AttrMetas *local_400;
  TimeSamples *local_3f8;
  GeomNurbsCurves *local_3f0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string local_338;
  string attr_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c8;
  TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
  local_2b8 [11];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar7 = (uint)options->strict_allowedToken_check;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&table,properties,&curves->super_GPrim,warn,err,
                     options->strict_allowedToken_check);
  if (bVar4) {
    p_Var14 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_400 = &(curves->ranges)._metas;
    local_3f0 = curves;
    while( true ) {
      bVar4 = (_Rb_tree_header *)p_Var14 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      if (bVar4) break;
      __x = p_Var14 + 1;
      ::std::__cxx11::string::string(local_50,(string *)__x);
      this = (Property *)(p_Var14 + 2);
      ::std::__cxx11::string::string((string *)&ss_e,"curveVertexCounts",(allocator *)&ret_8);
      pPVar15 = (Property *)&ss_e;
      (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50,(string *)this,(Property *)&ss_e,(string *)&curves->curveVertexCounts,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                 CONCAT44(in_stack_fffffffffffffb2c,uVar7));
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar6 = false;
        iVar8 = 3;
      }
      else {
        bVar6 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc60);
          ::std::operator<<(poVar9," ");
          ::std::__cxx11::string::string
                    ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_420);
          fmt::format<char[18],std::__cxx11::string>
                    ((string *)&ret_8,(fmt *)local_488,(string *)"curveVertexCounts",
                     (char (*) [18])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15);
          poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_488,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar6 = false;
          iVar8 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar6) {
        ::std::__cxx11::string::string(local_70,(string *)__x);
        ::std::__cxx11::string::string((string *)&ss_e,"points",(allocator *)&ret_8);
        pPVar15 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(string *)this,(Property *)&ss_e,(string *)&curves->points,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc61);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            fmt::format<char[7],std::__cxx11::string>
                      ((string *)&ret_8,(fmt *)local_488,(string *)"points",(char (*) [7])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        ::std::__cxx11::string::string(local_90,(string *)__x);
        ::std::__cxx11::string::string((string *)&ss_e,"velocities",(allocator *)&ret_8);
        pPVar15 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_90,(string *)this,(Property *)&ss_e,(string *)&curves->velocities,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc63);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            fmt::format<char[11],std::__cxx11::string>
                      ((string *)&ret_8,(fmt *)local_488,(string *)"velocities",
                       (char (*) [11])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        ::std::__cxx11::string::string(local_b0,(string *)__x);
        ::std::__cxx11::string::string((string *)&ss_e,"normals",(allocator *)&ret_8);
        pPVar15 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b0,(string *)this,(Property *)&ss_e,(string *)&curves->normals,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc65);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            fmt::format<char[8],std::__cxx11::string>
                      ((string *)&ret_8,(fmt *)local_488,(string *)"normals",(char (*) [8])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        ::std::__cxx11::string::string(local_d0,(string *)__x);
        ::std::__cxx11::string::string((string *)&ss_e,"accelerations",(allocator *)&ret_8);
        pPVar15 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d0,(string *)this,(Property *)&ss_e,(string *)&curves->accelerations,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc67);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            fmt::format<char[14],std::__cxx11::string>
                      ((string *)&ret_8,(fmt *)local_488,(string *)"accelerations",
                       (char (*) [14])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        ::std::__cxx11::string::string(local_f0,(string *)__x);
        ::std::__cxx11::string::string((string *)&ss_e,"widths",(allocator *)&ret_8);
        pPVar15 = (Property *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_f0,(string *)this,(Property *)&ss_e,(string *)&curves->widths,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc68);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            fmt::format<char[7],std::__cxx11::string>
                      ((string *)&ret_8,(fmt *)local_488,(string *)"widths",(char (*) [7])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        ::std::__cxx11::string::string(local_110,(string *)__x);
        ::std::__cxx11::string::string((string *)&ss_e,"order",(allocator *)&ret_8);
        pPVar15 = (Property *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_110,(string *)this,(Property *)&ss_e,(string *)&curves->order,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *
                   )CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc6b);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            fmt::format<char[6],std::__cxx11::string>
                      ((string *)&ret_8,(fmt *)local_488,(string *)"order",(char (*) [6])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        ::std::__cxx11::string::string(local_130,(string *)__x);
        ::std::__cxx11::string::string((string *)&ss_e,"knots",(allocator *)&ret_8);
        pPVar15 = this;
        args_1 = (Property *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<double,std::allocator<double>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_130,(string *)this,(Property *)&ss_e,(string *)&curves->knots,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc6c);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            pPVar15 = (Property *)&ret.err;
            fmt::format<char[6],std::__cxx11::string>
                      ((string *)&ret_8,(fmt *)local_488,(string *)"knots",(char (*) [6])pPVar15,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        ::std::__cxx11::string::string((string *)&local_2f8,(string *)__x);
        ::std::__cxx11::string::string((string *)&local_338,"ranges",&local_489);
        ret_8.err._M_dataplus._M_p = (pointer)&ret_8.err.field_2;
        ret_8.err._M_string_length = 0;
        ret_8.err.field_2._M_local_buf[0] = '\0';
        iVar8 = ::std::__cxx11::string::compare((string *)&local_2f8);
        if (iVar8 == 0) {
          if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            ret_8.code = PropertyTypeMismatch;
            ::std::__cxx11::string::string
                      ((string *)&ret,
                       "Property `{}` must be Attribute, but declared as Relationship.",
                       (allocator *)local_488);
            fmt::format<std::__cxx11::string>
                      ((string *)&ss_e,(fmt *)&ret,&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            ::std::__cxx11::string::operator=((string *)&ret_8.err,(string *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          if (p_Var14[6]._M_left != p_Var14[6]._M_parent) {
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(curves->ranges)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var14[6]._M_parent);
            ret_8.code = Success;
          }
          Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)this);
          tinyusdz::value::
          TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::
          type_name_abi_cxx11_();
          _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ss_e,&attr_type_name);
          if (_Var5) {
            ::std::__cxx11::string::_M_dispose();
LAB_001bbfed:
            iVar8 = *(int *)((long)&p_Var14[0x17]._M_parent + 4);
            if (iVar8 == 1) {
              bVar6 = Attribute::is_blocked((Attribute *)this);
              if (bVar6) {
                (local_3f0->ranges)._blocked = true;
              }
              this_00 = &p_Var14[4]._M_parent;
              bVar6 = primvar::PrimVar::has_value((PrimVar *)this_00);
              if ((bVar6) || (p_Var14[5]._M_left != p_Var14[5]._M_parent)) {
                local_2b8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                local_2b8[0]._17_8_ = 0;
                local_2b8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_2b8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                local_2b8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                aStack_2c8._M_allocated_capacity._0_2_ = 0;
                aStack_2c8._2_8_ = 0;
                _ss_e = (pointer)0x0;
                bVar6 = primvar::PrimVar::is_valid((PrimVar *)this_00);
                if (bVar6) {
                  bVar6 = primvar::PrimVar::has_value((PrimVar *)this_00);
                  if (!bVar6) {
                    p_Var16 = p_Var14[5]._M_parent;
                    p_Var11 = p_Var14[5]._M_left;
                    if (p_Var11 != p_Var16) goto LAB_001bc29a;
                    goto LAB_001bc432;
                  }
                  primvar::PrimVar::
                  get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                            (&local_420,(PrimVar *)this_00);
                  bVar6 = local_420.has_value_;
                  local_488[0] = (allocator)local_420.has_value_;
                  if ((allocator)local_420.has_value_ == (allocator)0x1) {
                    local_488._8_8_ = local_420.contained.data.__align;
                    aStack_478._M_allocated_capacity = local_420.contained._8_8_;
                    aStack_478._8_8_ = local_420.contained._16_8_;
                    local_420.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                    local_420.contained._8_8_ = 0;
                    local_420.contained._16_8_ = 0;
                    nonstd::optional_lite::
                    optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                    ::~optional(&local_420);
                    pvVar10 = nonstd::optional_lite::
                              optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                              ::value((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                       *)local_488);
                    Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                    ::set((Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                           *)&ss_e,pvVar10);
                  }
                  else {
                    nonstd::optional_lite::
                    optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                    ::~optional(&local_420);
                  }
                  nonstd::optional_lite::
                  optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                  ::~optional((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                               *)local_488);
                  p_Var16 = p_Var14[5]._M_parent;
                  p_Var11 = p_Var14[5]._M_left;
                  if (p_Var11 == p_Var16) {
                    if ((allocator)bVar6 == (allocator)0x0) goto LAB_001bc432;
                  }
                  else {
LAB_001bc29a:
                    local_3f8 = (TimeSamples *)&p_Var14[5]._M_parent;
                    lVar18 = 0;
                    for (uVar17 = 0; uVar17 < (ulong)(((long)p_Var11 - (long)p_Var16) / 0x28);
                        uVar17 = uVar17 + 1) {
                      pvVar12 = tinyusdz::value::TimeSamples::get_samples(local_3f8);
                      pSVar1 = (pvVar12->
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      if ((&pSVar1->blocked)[lVar18] == true) {
                        TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                        ::add_blocked_sample(local_2b8,*(double *)((long)&pSVar1->t + lVar18));
                      }
                      else {
                        tinyusdz::value::Value::
                        get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                                  (&local_420,(Value *)((long)&(pSVar1->value).v_.storage + lVar18),
                                   false);
                        local_488[0] = (allocator)local_420.has_value_;
                        if ((allocator)local_420.has_value_ == (allocator)0x1) {
                          local_488._8_8_ = local_420.contained.data.__align;
                          aStack_478._M_allocated_capacity = local_420.contained._8_8_;
                          aStack_478._8_8_ = local_420.contained._16_8_;
                          local_420.contained.data.__align =
                               (anon_struct_8_0_00000001_for___align)0x0;
                          local_420.contained._8_8_ = 0;
                          local_420.contained._16_8_ = 0;
                        }
                        nonstd::optional_lite::
                        optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                        ::~optional(&local_420);
                        aVar2 = local_488[0];
                        if (local_488[0] == (allocator)0x1) {
                          t = *(double *)((long)&pSVar1->t + lVar18);
                          pvVar10 = nonstd::optional_lite::
                                    optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                    ::value((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                             *)local_488);
                          TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                          ::add_sample(local_2b8,t,pvVar10);
                        }
                        else {
                          ret.err.field_2._M_allocated_capacity = 0;
                          ret.err.field_2._8_8_ = 0;
                          ret.err._M_dataplus._M_p = (pointer)0x0;
                          ret.err._M_string_length = 0;
                        }
                        nonstd::optional_lite::
                        optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                        ::~optional((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                     *)local_488);
                        if (aVar2 == (allocator)0x0) {
                          ret.code = ret.code & 0xffffff00;
                          goto LAB_001bc441;
                        }
                      }
                      p_Var16 = p_Var14[5]._M_parent;
                      p_Var11 = p_Var14[5]._M_left;
                      lVar18 = lVar18 + 0x28;
                    }
                    ret.code = ret.code & 0xffffff00;
                  }
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                  ::
                  optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>,_0>
                            ((optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                              *)&ret,(Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                      *)&ss_e);
                }
                else {
LAB_001bc432:
                  ret.code = ret.code & 0xffffff00;
                  ret.err.field_2._M_allocated_capacity = 0;
                  ret.err.field_2._8_8_ = 0;
                  ret.err._M_dataplus._M_p = (pointer)0x0;
                  ret.err._M_string_length = 0;
                }
LAB_001bc441:
                Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                ::~Animatable((Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                               *)&ss_e);
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                ::
                optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>,_0>
                          ((optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                            *)&ss_e,(optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                                     *)&ret);
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                ::~optional((optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                             *)&ret);
                oVar3 = ss_e;
                if (ss_e == (ostringstream)0x1) {
                  value = nonstd::optional_lite::
                          optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                          ::value((optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                                   *)&ss_e);
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
                  ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
                               *)&(curves->ranges)._attrib,value);
                }
                else {
                  ret_8.code = InternalError;
                  ::std::__cxx11::string::assign((char *)&ret_8.err);
                }
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                ::~optional((optional<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                             *)&ss_e);
                if (oVar3 == (ostringstream)0x0) goto LAB_001bc4d8;
                AttrMetas::operator=(local_400,(AttrMetas *)(p_Var14 + 7));
                goto LAB_001bc4c6;
              }
              if (p_Var14[6]._M_left == p_Var14[6]._M_parent) goto LAB_001bc4d8;
              AttrMetas::operator=(local_400,(AttrMetas *)(p_Var14 + 7));
              __v = (string *)&local_2f8;
            }
            else {
              if (iVar8 != 0) {
                ::std::__cxx11::string::assign((char *)&ret_8.err);
                ret_8.code = InternalError;
                goto LAB_001bc4d8;
              }
              (local_3f0->ranges)._value_empty = true;
              AttrMetas::operator=(local_400,(AttrMetas *)(p_Var14 + 7));
LAB_001bc4c6:
              __v = &local_338;
            }
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
            ret_8.code = Success;
          }
          else {
            tinyusdz::value::
            TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::
            underlying_type_name_abi_cxx11_();
            _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,&attr_type_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (_Var5) goto LAB_001bbfed;
            ret_8.code = TypeMismatch;
            ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)aStack_2c8._M_local_buf,"Property type mismatch. "
                                      );
            poVar9 = ::std::operator<<(poVar9,(string *)&local_338);
            poVar9 = ::std::operator<<(poVar9," expects type `");
            tinyusdz::value::
            TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::
            type_name_abi_cxx11_();
            poVar9 = ::std::operator<<(poVar9,(string *)&ret);
            poVar9 = ::std::operator<<(poVar9,"` but defined as type `");
            poVar9 = ::std::operator<<(poVar9,(string *)&attr_type_name);
            ::std::operator<<(poVar9,"`");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)&ret_8.err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
          }
LAB_001bc4d8:
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ret_8.code = Unmatched;
        }
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret_8.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret_8.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc6d);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            fmt::format<char[7],std::__cxx11::string>
                      ((string *)&ret,(fmt *)local_488,(string *)"ranges",(char (*) [7])&ret_8.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        ::std::__cxx11::string::string(local_150,(string *)__x);
        ::std::__cxx11::string::string((string *)&ss_e,"pointWeights",(allocator *)&ret_8);
        pPVar15 = (Property *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<double,std::allocator<double>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_150,(string *)this,(Property *)&ss_e,(string *)&curves->pointWeights,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb2c,uVar7));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc6e);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)local_488,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_420);
            fmt::format<char[13],std::__cxx11::string>
                      ((string *)&ret_8,(fmt *)local_488,(string *)"pointWeights",
                       (char (*) [13])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar15)
            ;
            poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_8);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_488,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&ret_8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_001bc96c;
        sVar13 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&table,(key_type *)__x);
        if (sVar13 == 0) {
          this_01 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](&(curves->super_GPrim).props,(key_type *)__x);
          Property::operator=(this_01,this);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
        }
        sVar13 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&table,(key_type *)__x);
        if (sVar13 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)&ss_e,"[warn]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xc72);
          ::std::operator<<(poVar9," ");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x)
          ;
          poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ret_8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        }
      }
      else {
LAB_001bc96c:
        if ((iVar8 != 3) && (iVar8 != 0)) goto LAB_001bc9a4;
      }
      p_Var14 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14);
    }
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
LAB_001bc9a4:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar4;
}

Assistant:

bool ReconstructPrim(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomNurbsCurves *curves,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, curves, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "curveVertexCounts", GeomNurbsCurves,
                         curves->curveVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomNurbsCurves, curves->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomNurbsCurves,
                          curves->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomNurbsCurves,
                  curves->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomNurbsCurves,
                 curves->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomNurbsCurves, curves->widths)

    //
    PARSE_TYPED_ATTRIBUTE(table, prop, "order", GeomNurbsCurves, curves->order)
    PARSE_TYPED_ATTRIBUTE(table, prop, "knots", GeomNurbsCurves, curves->knots)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ranges", GeomNurbsCurves, curves->ranges)
    PARSE_TYPED_ATTRIBUTE(table, prop, "pointWeights", GeomNurbsCurves, curves->pointWeights)

    ADD_PROPERTY(table, prop, GeomBasisCurves, curves->props)

    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}